

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O2

DequeueStatus __thiscall
tracy::Profiler::DequeueContextSwitches(Profiler *this,ConsumerToken *token,int64_t *timeStop)

{
  ProducerBase *pPVar1;
  bool bVar2;
  DequeueStatus DVar3;
  size_t sVar4;
  ConcurrentQueueProducerTypelessBase *pCVar5;
  ProducerBase *pPVar6;
  DequeueStatus DVar7;
  ProducerBase *pPVar8;
  
  if ((token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) ||
     (token->lastKnownGlobalOffset != DAT_00883484)) {
    bVar2 = moodycamel::
            ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
            update_current_producer_after_rotation
                      ((ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                        *)&s_queue,token);
    if (!bVar2) {
LAB_0038d063:
      bVar2 = false;
      goto LAB_0038d071;
    }
  }
  sVar4 = moodycamel::
          ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
          ProducerBase::
          dequeue_bulk<tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__0,tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__1>
                    ((ProducerBase *)&token->currentProducer[-1].threadId,this,timeStop);
  token->itemsConsumedFromCurrent = token->itemsConsumedFromCurrent + (int)sVar4;
  pPVar1 = s_queue;
  pCVar5 = token->currentProducer;
  pPVar8 = (ProducerBase *)&pCVar5->next[-1].threadId;
  if (pCVar5->next == (ConcurrentQueueProducerTypelessBase *)0x0) {
    pPVar8 = s_queue;
  }
  if (sVar4 == 0) {
    while( true ) {
      pPVar6 = (ProducerBase *)&pCVar5[-1].threadId;
      if (pCVar5 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pPVar6 = (ProducerBase *)0x0;
      }
      if (pPVar8 == pPVar6) goto LAB_0038d063;
      sVar4 = moodycamel::
              ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              ProducerBase::
              dequeue_bulk<tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__0,tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__1>
                        (pPVar8,this,timeStop);
      if (sVar4 != 0) break;
      pCVar5 = ((ConcurrentQueueProducerTypelessBase *)(pPVar8 + 8))->next;
      pPVar8 = (ProducerBase *)&pCVar5[-1].threadId;
      if (pCVar5 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pPVar8 = pPVar1;
      }
      pCVar5 = token->currentProducer;
    }
    token->currentProducer = (ConcurrentQueueProducerTypelessBase *)(pPVar8 + 8);
  }
  else {
    pCVar5 = (ConcurrentQueueProducerTypelessBase *)(pPVar8 + 8);
    if (pPVar8 == (ProducerBase *)0x0) {
      pCVar5 = (ConcurrentQueueProducerTypelessBase *)0x0;
    }
    token->currentProducer = pCVar5;
    sVar4 = 0;
  }
  token->itemsConsumedFromCurrent = (uint32_t)sVar4;
  bVar2 = true;
LAB_0038d071:
  DVar7 = DataDequeued;
  if (!bVar2) {
    DVar7 = (uint)(*timeStop != -1) * 2;
  }
  DVar3 = ConnectionLost;
  if (*timeStop != -2) {
    DVar3 = DVar7;
  }
  return DVar3;
}

Assistant:

Profiler::DequeueStatus Profiler::DequeueContextSwitches( tracy::moodycamel::ConsumerToken& token, int64_t& timeStop )
{
    const auto sz = GetQueue().try_dequeue_bulk_single( token, [] ( const uint64_t& ) {},
        [this, &timeStop] ( QueueItem* item, size_t sz )
        {
            assert( sz > 0 );
            int64_t refCtx = m_refTimeCtx;
            while( sz-- > 0 )
            {
                FreeAssociatedMemory( *item );
                if( timeStop < 0 ) return;
                const auto idx = MemRead<uint8_t>( &item->hdr.idx );
                if( idx == (uint8_t)QueueType::ContextSwitch )
                {
                    const auto csTime = MemRead<int64_t>( &item->contextSwitch.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->contextSwitch.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ContextSwitch] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                else if( idx == (uint8_t)QueueType::ThreadWakeup )
                {
                    const auto csTime = MemRead<int64_t>( &item->threadWakeup.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->threadWakeup.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ThreadWakeup] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                item++;
            }
            m_refTimeCtx = refCtx;
        }
    );

    if( timeStop == -2 ) return DequeueStatus::ConnectionLost;
    return ( timeStop == -1 || sz > 0 ) ? DequeueStatus::DataDequeued : DequeueStatus::QueueEmpty;
}